

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPCompoundPacket::RTCPCompoundPacket
          (RTCPCompoundPacket *this,uint8_t *packet,size_t packetlen,bool deletedata,
          RTPMemoryManager *mgr)

{
  int iVar1;
  iterator local_50;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_48 [3];
  RTPMemoryManager *local_30;
  RTPMemoryManager *mgr_local;
  size_t sStack_20;
  bool deletedata_local;
  size_t packetlen_local;
  uint8_t *packet_local;
  RTCPCompoundPacket *this_local;
  
  local_30 = mgr;
  mgr_local._7_1_ = deletedata;
  sStack_20 = packetlen;
  packetlen_local = (size_t)packet;
  packet_local = (uint8_t *)this;
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_00192780;
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::list
            (&this->rtcppacklist);
  std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&this->rtcppackit);
  this->compoundpacket = (uint8_t *)0x0;
  this->compoundpacketlength = 0;
  iVar1 = ParseData(this,(uint8_t *)packetlen_local,sStack_20);
  this->error = iVar1;
  if (-1 < this->error) {
    this->compoundpacket = (uint8_t *)packetlen_local;
    this->compoundpacketlength = sStack_20;
    this->deletepacket = (bool)(mgr_local._7_1_ & 1);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::begin
                   (&this->rtcppacklist);
    std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(local_48,&local_50);
    (this->rtcppackit)._M_node = local_48[0]._M_node;
  }
  return;
}

Assistant:

RTCPCompoundPacket::RTCPCompoundPacket(uint8_t *packet, size_t packetlen, bool deletedata, RTPMemoryManager *mgr) : RTPMemoryObject(mgr)
{
	compoundpacket = 0;
	compoundpacketlength = 0;
	
	error = ParseData(packet,packetlen);
	if (error < 0)
		return;
	
	compoundpacket = packet;
	compoundpacketlength = packetlen;
	deletepacket = deletedata;

	rtcppackit = rtcppacklist.begin();
}